

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void emap_rtree_write_acquired
               (tsdn_t *tsdn,emap_t *emap,rtree_leaf_elm_t *elm_a,rtree_leaf_elm_t *elm_b,
               edata_t *edata,szind_t szind,_Bool slab)

{
  void *pvVar1;
  ulong uVar2;
  base_t *pbVar3;
  ulong uVar4;
  
  if (elm_a == (rtree_leaf_elm_t *)0x0) {
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    pvVar1 = (elm_a->le_bits).repr;
    uVar2 = (ulong)((uint)((ulong)pvVar1 >> 0x2b) & 2);
    uVar4 = (ulong)((uint)((ulong)pvVar1 >> 0xf) & 0x1c);
  }
  pbVar3 = (base_t *)
           ((ulong)edata & 0xff | uVar2 | (long)elm_b << 0x30 | uVar4 |
           (ulong)elm_a & 0xffffffffffff);
  *(base_t **)&tsdn->tsd = pbVar3;
  if (emap != (emap_t *)0x0) {
    (emap->rtree).base = pbVar3;
  }
  return;
}

Assistant:

static void
emap_rtree_write_acquired(tsdn_t *tsdn, emap_t *emap, rtree_leaf_elm_t *elm_a,
    rtree_leaf_elm_t *elm_b, edata_t *edata, szind_t szind, bool slab) {
	rtree_contents_t contents;
	contents.edata = edata;
	contents.metadata.szind = szind;
	contents.metadata.slab = slab;
	contents.metadata.is_head = (edata == NULL) ? false :
	    edata_is_head_get(edata);
	contents.metadata.state = (edata == NULL) ? 0 : edata_state_get(edata);
	rtree_leaf_elm_write(tsdn, &emap->rtree, elm_a, contents);
	if (elm_b != NULL) {
		rtree_leaf_elm_write(tsdn, &emap->rtree, elm_b, contents);
	}
}